

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::ContactMaterial::ContactMaterial(ContactMaterial *this,RoboSimian *robot)

{
  ChSystem *pCVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<chrono::robosimian::ContactMaterial> shared_this;
  ContactMaterial *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  ContactMaterial *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (this->super_AddContactCallback)._vptr_AddContactCallback =
       (_func_int **)&PTR__AddContactCallback_0017da90;
  this->m_robot = robot;
  local_20 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::ContactMaterial*,chrono::robosimian::ContactMaterial::ContactMaterial(chrono::robosimian::RoboSimian*)::_lambda(chrono::robosimian::ContactMaterial*)_1_,std::allocator<void>,void>
            (&local_18,this);
  pCVar1 = this->m_robot->m_system;
  plVar2 = *(long **)(pCVar1 + 0x158);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pCVar1 + 0x160);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_30 = local_20;
  local_28 = local_18._M_pi;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x210))(plVar2,&local_30);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return;
}

Assistant:

ContactMaterial(RoboSimian* robot) : m_robot(robot) {
        std::shared_ptr<ContactMaterial> shared_this(this, [](ContactMaterial*) {});
        m_robot->GetSystem()->GetContactContainer()->RegisterAddContactCallback(shared_this);
    }